

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xstring.c
# Opt level: O0

char * xultoa(char *buf,unsigned_long val,uint radix)

{
  char cVar1;
  int iVar2;
  int local_2c;
  int iStack_28;
  char c;
  int r;
  int l;
  uint radix_local;
  unsigned_long val_local;
  char *buf_local;
  
  iStack_28 = 0;
  local_2c = 0;
  iVar2 = local_2c;
  _l = val;
  if (val == 0) {
    *buf = '0';
    buf[1] = '\0';
  }
  else {
    do {
      local_2c = iVar2;
      buf[local_2c] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[_l % (ulong)radix];
      _l = _l / radix;
      iVar2 = local_2c + 1;
    } while (_l != 0);
    buf[local_2c + 1] = '\0';
    while (iStack_28 < local_2c) {
      cVar1 = buf[iStack_28];
      buf[iStack_28] = buf[local_2c];
      buf[local_2c] = cVar1;
      local_2c = local_2c + -1;
      iStack_28 = iStack_28 + 1;
    }
  }
  return buf;
}

Assistant:

char* xultoa(char* buf, unsigned long val, unsigned radix)
{
    int l = 0;
    int r = 0;
    char c;

    if (!val)
    {
        buf[0] = '0';
        buf[1] = '\0';
        return buf;
    }

    do
    {
        buf[r++] = g_xstr_i2c_table[val % radix];
        val /= radix;
    }
    while (val);

    buf[r--] = '\0';

    /* string reverse */
    while (l < r)
    {
        c = buf[l];
        buf[l++] = buf[r];
        buf[r--] = c;
    }

    return buf;
}